

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O1

void __thiscall
rsg::SubValueRangeIterator::SubValueRangeIterator
          (SubValueRangeIterator *this,ConstValueRangeAccess *valueRange)

{
  pointer *ppCVar1;
  pointer pCVar2;
  Scalar *pSVar3;
  
  (this->m_stack).
  super__Vector_base<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_stack).
  super__Vector_base<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_stack).
  super__Vector_base<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar2 = (this->m_stack).
           super__Vector_base<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar2 == (pointer)0x0) {
    std::vector<rsg::ConstValueRangeAccess,std::allocator<rsg::ConstValueRangeAccess>>::
    _M_realloc_insert<rsg::ConstValueRangeAccess_const&>
              ((vector<rsg::ConstValueRangeAccess,std::allocator<rsg::ConstValueRangeAccess>> *)this
               ,(iterator)0x0,valueRange);
  }
  else {
    pCVar2->m_max = valueRange->m_max;
    pSVar3 = valueRange->m_min;
    pCVar2->m_type = valueRange->m_type;
    pCVar2->m_min = pSVar3;
    ppCVar1 = &(this->m_stack).
               super__Vector_base<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppCVar1 = *ppCVar1 + 1;
  }
  return;
}

Assistant:

SubValueRangeIterator::SubValueRangeIterator (const ConstValueRangeAccess& valueRange)
{
	m_stack.push_back(valueRange);
}